

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  FilePath local_58;
  undefined1 local_38 [8];
  FilePath parent;
  
  sVar1 = (this->pathname_)._M_string_length;
  if ((sVar1 == 0) || ((this->pathname_)._M_dataplus._M_p[sVar1 - 1] != '/')) {
    bVar3 = false;
  }
  else {
    bVar2 = DirectoryExists(this);
    bVar3 = true;
    if (!bVar2) {
      RemoveTrailingPathSeparator(&local_58,this);
      RemoveFileName((FilePath *)local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      bVar3 = CreateDirectoriesRecursively((FilePath *)local_38);
      if (bVar3) {
        bVar3 = CreateFolder(this);
      }
      else {
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  return bVar3;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.empty() || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}